

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-messages.c
# Opt level: O3

void insert_msg(borg_read_messages *msgs,borg_read_message *msg,wchar_t spell_number)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  borg_read_message *pbVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  
  if (msgs->messages == (borg_read_message *)0x0) {
    msgs->allocated = 10;
    pbVar5 = (borg_read_message *)mem_alloc(0xf0);
    msgs->messages = pbVar5;
    piVar6 = (int *)mem_alloc((long)msgs->allocated << 2);
    msgs->index = piVar6;
  }
  if (msg == (borg_read_message *)0x0) {
    pbVar5 = msgs->messages;
    iVar4 = msgs->count;
    lVar7 = (long)iVar4;
    pbVar5[lVar7].message_p1 = (char *)0x0;
    pbVar5[lVar7].message_p2 = (char *)0x0;
    pbVar5[lVar7].message_p3 = (char *)0x0;
    msgs->count = iVar4 + 1;
    pbVar5 = (borg_read_message *)mem_realloc(pbVar5,lVar7 * 0x18 + 0x18);
    msgs->messages = pbVar5;
    piVar6 = (int *)mem_realloc(msgs->index,(long)msgs->count << 2);
    msgs->index = piVar6;
    msgs->allocated = msgs->count;
  }
  else {
    lVar7 = (long)msgs->count;
    pbVar5 = msgs->messages;
    if (0 < lVar7) {
      pcVar1 = msg->message_p1;
      lVar8 = 0;
      do {
        pcVar2 = *(char **)((long)&pbVar5->message_p1 + lVar8);
        if (pcVar2 == (char *)0x0) {
          if (pcVar1 == (char *)0x0) goto LAB_0023848f;
        }
        else if ((pcVar1 != (char *)0x0) && (iVar4 = strcmp(pcVar2,pcVar1), iVar4 == 0)) {
LAB_0023848f:
          pcVar2 = *(char **)((long)&pbVar5->message_p2 + lVar8);
          pcVar3 = msg->message_p2;
          if (pcVar2 == (char *)0x0) {
            if (pcVar3 == (char *)0x0) goto LAB_002384b2;
          }
          else if ((pcVar3 != (char *)0x0) && (iVar4 = strcmp(pcVar2,pcVar3), iVar4 == 0)) {
LAB_002384b2:
            pcVar2 = *(char **)((long)&pbVar5->message_p3 + lVar8);
            pcVar3 = msg->message_p3;
            if (pcVar2 == (char *)0x0) {
              if (pcVar3 == (char *)0x0) goto LAB_002385b3;
            }
            else if ((pcVar3 != (char *)0x0) && (iVar4 = strcmp(pcVar2,pcVar3), iVar4 == 0)) {
LAB_002385b3:
              string_free(pcVar1);
              string_free(msg->message_p2);
              string_free(msg->message_p3);
              return;
            }
          }
        }
        lVar8 = lVar8 + 0x18;
      } while (lVar7 * 0x18 != lVar8);
    }
    pbVar5[lVar7].message_p3 = msg->message_p3;
    pcVar1 = msg->message_p2;
    pbVar5[lVar7].message_p1 = msg->message_p1;
    pbVar5[lVar7].message_p2 = pcVar1;
    msgs->index[msgs->count] = spell_number;
    iVar4 = msgs->count;
    msgs->count = iVar4 + 1;
    if (iVar4 + 1 == msgs->allocated) {
      msgs->allocated = iVar4 + 0xb;
      pbVar5 = (borg_read_message *)mem_realloc(msgs->messages,((long)iVar4 * 8 + 0x58) * 3);
      msgs->messages = pbVar5;
      piVar6 = (int *)mem_realloc(msgs->index,(long)msgs->allocated << 2);
      msgs->index = piVar6;
    }
  }
  return;
}

Assistant:

static void insert_msg(struct borg_read_messages *msgs,
    struct borg_read_message *msg, int spell_number)
{
    int  i;
    bool found_dup = false;

    /* this way we don't have to pre-create the array */
    if (msgs->messages == NULL) {
        msgs->allocated = 10;
        msgs->messages
            = mem_alloc(sizeof(struct borg_read_message) * msgs->allocated);
        msgs->index = mem_alloc(sizeof(int) * msgs->allocated);
    }

    if (msg == NULL) {
        msgs->messages[msgs->count].message_p1 = NULL;
        msgs->messages[msgs->count].message_p2 = NULL;
        msgs->messages[msgs->count].message_p3 = NULL;
        msgs->count++;
        /* shrink array down, we are done*/
        msgs->messages = mem_realloc(
            msgs->messages, sizeof(struct borg_read_message) * msgs->count);
        msgs->index     = mem_realloc(msgs->index, sizeof(int) * msgs->count);
        msgs->allocated = msgs->count;
        return;
    }

    for (i = 0; i < msgs->count; i++) {
        if (borg_read_message_equal(&msgs->messages[i], msg)) {
            found_dup = true;
            break;
        }
    }
    if (!found_dup) {
        memcpy(&(msgs->messages[msgs->count]), msg,
            sizeof(struct borg_read_message));
        msgs->index[msgs->count] = spell_number;
        msgs->count++;
        if (msgs->count == msgs->allocated) {
            msgs->allocated += 10;
            msgs->messages = mem_realloc(msgs->messages,
                sizeof(struct borg_read_message) * msgs->allocated);
            msgs->index
                = mem_realloc(msgs->index, sizeof(int) * msgs->allocated);
        }
    } else {
        string_free(msg->message_p1);
        string_free(msg->message_p2);
        string_free(msg->message_p3);
    }
}